

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i,real a)

{
  pointer pfVar1;
  pointer pfVar2;
  int64_t iVar3;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                  ,0x37,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  iVar3 = Matrix::size(A,0);
  if (i < iVar3) {
    pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = Matrix::size(A,1);
    if ((long)pfVar1 - (long)pfVar2 >> 2 == iVar3) {
      (*A->_vptr_Matrix[5])((ulong)(uint)a,A,this,i & 0xffffffff);
      return;
    }
    __assert_fail("size() == A.size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                  ,0x39,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  __assert_fail("i < A.size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                ,0x38,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i, real a) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  A.addRowToVector(*this, i, a);
}